

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QMidiBuffer.cpp
# Opt level: O3

bool __thiscall QMidiBuffer::requestSpace(QMidiBuffer *this,quint32 eventLength)

{
  undefined4 *puVar1;
  quint32 bytesWritten;
  ulong uVar2;
  
  puVar1 = (undefined4 *)this->writePointer;
  if (puVar1 == (undefined4 *)0x0) {
    puVar1 = (undefined4 *)
             Utility::QRingBuffer::writePointer
                       (&this->ringBuffer,&this->bytesToWrite,&this->freeSpaceContiguous);
    this->writePointer = puVar1;
  }
  uVar2 = (ulong)this->bytesToWrite;
  if (uVar2 < (ulong)eventLength + 4) {
    do {
      if (this->freeSpaceContiguous == true) {
        return eventLength <= (uint)uVar2;
      }
      *puVar1 = 2;
      bytesWritten = (uint)uVar2 + this->bytesWritten;
      this->bytesWritten = bytesWritten;
      Utility::QRingBuffer::advanceWritePointer(&this->ringBuffer,bytesWritten);
      this->writePointer = (void *)0x0;
      this->bytesWritten = 0;
      this->bytesToWrite = 0;
      puVar1 = (undefined4 *)
               Utility::QRingBuffer::writePointer
                         (&this->ringBuffer,&this->bytesToWrite,&this->freeSpaceContiguous);
      this->writePointer = puVar1;
      uVar2 = (ulong)this->bytesToWrite;
    } while (uVar2 < (ulong)eventLength + 4);
  }
  return true;
}

Assistant:

bool QMidiBuffer::requestSpace(quint32 eventLength) {
	if (writePointer == NULL) {
		writePointer = ringBuffer.writePointer(bytesToWrite, freeSpaceContiguous);
	}
	while (bytesToWrite < (eventLength + sizeof(MidiEventHeader))) {
		if (freeSpaceContiguous) return eventLength <= bytesToWrite;
		// When the free space isn't contiguous, pad the rest of the ring buffer
		// and restart from the beginning.
		MidiEventHeader *padHeader = static_cast<MidiEventHeader *>(writePointer);
		padHeader->eventType = MidiEventLayout::MidiEventType_PAD;
		bytesWritten += bytesToWrite;
		flush();
		writePointer = ringBuffer.writePointer(bytesToWrite, freeSpaceContiguous);
	}
	return true;
}